

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O2

wchar_t __thiscall
CVmFormatter::parse_html_markup(CVmFormatter *this,wchar_t c,char **sp,size_t *slenp)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  os_color_t oVar5;
  undefined4 uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  wchar_t c_00;
  uint uVar12;
  long lVar13;
  uint local_29c;
  wchar_t tagbuf [50];
  wchar_t dashbuf [100];
  
  if (c == L'&') {
    wVar7 = parse_entity(this,dashbuf,sp,slenp);
    buffer_char(this,dashbuf[0]);
    return wVar7;
  }
  if (c != L'<') {
    buffer_char(this,c);
    wVar7 = next_wchar(sp,slenp);
    return wVar7;
  }
  wVar7 = next_wchar(sp,slenp);
  if ((wVar7 == L'\\') || (wVar7 == L'/')) {
    wVar8 = next_wchar(sp,slenp);
    local_29c = 1;
  }
  else {
    local_29c = 0;
    wVar8 = wVar7;
  }
  lVar13 = 0;
  while ((0x3e < (uint)wVar8 || ((0x4000000100000001U >> ((ulong)(uint)wVar8 & 0x3f) & 1) == 0))) {
    if (lVar13 < 0xc4) {
      *(wchar_t *)((long)tagbuf + lVar13) = wVar8;
      lVar13 = lVar13 + 4;
    }
    wVar8 = next_wchar(sp,slenp);
  }
  *(undefined4 *)((long)tagbuf + lVar13) = 0;
  iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"br");
  if (iVar9 != 0) {
    if (this->html_in_ignore_ == 0) {
      if (this->linepos_ == 0) {
        this->html_defer_br_ = HTML_DEFER_BR_BLANK;
      }
      else {
        this->html_defer_br_ = HTML_DEFER_BR_FLUSH;
      }
    }
    goto LAB_002685af;
  }
  iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"b");
  if ((((iVar9 == 0) && (iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"i"), iVar9 == 0)) &&
      (iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"em"), iVar9 == 0)) &&
     (iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"strong"), iVar9 == 0)) {
    iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"p");
    if (iVar9 == 0) {
      iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"tab");
      if ((iVar9 != 0) && (this->html_in_ignore_ == 0)) {
        expand_pending_tab(this,1);
        this->field_0xefe8 = this->field_0xefe8 | 8;
        this->new_tab_entry_ = (CVmFmtTabStop *)0x0;
        this->new_tab_align_ = VMFMT_TAB_NONE;
        this->new_tab_dp_ = L'\0';
        goto LAB_002685af;
      }
      iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"img");
      if ((iVar9 != 0) || (iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"sound"), iVar9 != 0)) {
        this->field_0xefe8 = this->field_0xefe8 | 1;
        goto LAB_002685af;
      }
      iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"font");
      if (iVar9 != 0) {
        if (this->html_in_ignore_ != 0) goto LAB_002685af;
        if ((wVar7 != L'/') && (wVar7 != L'\\')) {
          this->field_0xefe8 = this->field_0xefe8 | 2;
          push_color(this);
          goto LAB_002685af;
        }
        goto LAB_00268536;
      }
      iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"body");
      if (iVar9 != 0) {
        if (((this->html_in_ignore_ == 0) && (wVar7 != L'/')) && (wVar7 != L'\\')) {
          this->field_0xefe8 = this->field_0xefe8 | 4;
        }
        goto LAB_002685af;
      }
      iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"hr");
      if (iVar9 == 0) {
        iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"q");
        if (iVar9 == 0) {
          iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"title");
          if (iVar9 == 0) {
            iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"aboutbox");
            if ((iVar9 == 0) && (iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"banner"), iVar9 == 0)) {
              iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"log");
              if (iVar9 == 0) {
                iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"nolog");
                if (iVar9 == 0) {
                  iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"wrap");
                  if (iVar9 == 0) {
                    iVar9 = CVmCaseFoldStr::wstreq(tagbuf,L"pre");
                    if (iVar9 != 0) {
                      if ((wVar7 != L'/') && (wVar7 != L'\\')) {
                        this->html_pre_level_ = this->html_pre_level_ + 1;
                      }
                      write_blank_line(this);
                      if (((wVar7 == L'\\') || (wVar7 == L'/')) && (this->html_pre_level_ != 0)) {
                        this->html_pre_level_ = this->html_pre_level_ + -1;
                      }
                    }
                  }
                  else if (this->html_in_ignore_ == 0) {
                    this->field_0xefe8 = this->field_0xefe8 | 0x10;
                  }
                }
                else {
                  (*this->_vptr_CVmFormatter[0x10])(this,(ulong)local_29c);
                }
              }
              else {
                (*this->_vptr_CVmFormatter[0x11])(this,(ulong)local_29c);
              }
            }
            else if ((wVar7 == L'\\') || (wVar7 == L'/')) {
              this->html_in_ignore_ = this->html_in_ignore_ + -1;
            }
            else {
              this->html_in_ignore_ = this->html_in_ignore_ + 1;
            }
          }
          else if ((wVar7 == L'\\') || (wVar7 == L'/')) {
            uVar2 = this->html_in_ignore_;
            uVar3 = this->html_in_title_;
            this->html_in_ignore_ = uVar2 + -1;
            this->html_in_title_ = uVar3 + -1;
            if ((uVar3 + -1 == 0) &&
               ((this->html_title_ptr_ != (char *)0x0 &&
                (*this->html_title_ptr_ = '\0', this->html_in_ignore_ == 0)))) {
              (*this->_vptr_CVmFormatter[10])(this,this->html_title_buf_);
            }
          }
          else {
            if (this->html_in_title_ == 0) {
              this->html_title_ptr_ = this->html_title_buf_;
            }
            this->html_in_ignore_ = this->html_in_ignore_ + 1;
            this->html_in_title_ = this->html_in_title_ + 1;
          }
        }
        else if (this->html_in_ignore_ == 0) {
          if ((wVar7 == L'/') || (wVar7 == L'\\')) {
            c_00 = ((byte)this->html_quote_level_ & 1) * 4 + L'’';
          }
          else {
            uVar12 = this->html_quote_level_;
            this->html_quote_level_ = uVar12 + 1;
            c_00 = (uint)((uVar12 & 1) == 0) * 4 + L'‘';
          }
          buffer_char(this,c_00);
          if ((wVar7 == L'\\') || (wVar7 == L'/')) {
            this->html_quote_level_ = this->html_quote_level_ + -1;
          }
        }
        goto LAB_002685af;
      }
      if (this->html_in_ignore_ != 0) goto LAB_002685af;
      flush(this,VM_NL_NEWLINE);
      iVar9 = (*this->console_->_vptr_CVmConsole[6])();
      for (uVar12 = iVar9 - 1; 0 < (int)uVar12; uVar12 = uVar12 - (int)uVar10) {
        uVar10 = 99;
        if (uVar12 < 99) {
          uVar10 = (ulong)uVar12;
        }
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          dashbuf[uVar11] = L'-';
        }
        dashbuf[uVar11] = L'\0';
        buffer_wstring(this,dashbuf);
      }
    }
    else if (this->html_in_ignore_ != 0) goto LAB_002685af;
    write_blank_line(this);
    goto LAB_002685af;
  }
  if (this->html_in_ignore_ != 0) goto LAB_002685af;
  if ((wVar7 == L'/') || (wVar7 == L'\\')) {
LAB_00268536:
    sVar4 = this->color_sp_;
    if (sVar4 != 0) {
      this->color_sp_ = sVar4 - 1;
      oVar5 = this->color_stack_[sVar4 - 1].bg;
      (this->cur_color_).fg = this->color_stack_[sVar4 - 1].fg;
      (this->cur_color_).bg = oVar5;
      uVar6 = *(undefined4 *)&this->color_stack_[sVar4 - 1].field_0x14;
      (this->cur_color_).attr = this->color_stack_[sVar4 - 1].attr;
      *(undefined4 *)&(this->cur_color_).field_0x14 = uVar6;
    }
    goto LAB_002685af;
  }
  push_color(this);
  uVar12 = 1;
  if (tagbuf[0] == L'I') {
LAB_002685a2:
    uVar12 = 2;
  }
  else if ((tagbuf[0] == L'S') || (tagbuf[0] == L's')) {
    uVar12 = 0;
  }
  else if (tagbuf[0] == L'i') goto LAB_002685a2;
  piVar1 = &(this->cur_color_).attr;
  *piVar1 = *piVar1 | uVar12;
LAB_002685af:
  this->html_parse_state_ = VMCON_HPS_TAG;
  return wVar8;
}

Assistant:

wchar_t CVmFormatter::parse_html_markup(VMG_ wchar_t c,
                                        const char **sp, size_t *slenp)
{
    /* check what we have */
    if (c == '<')
    {
        const size_t MAX_TAG_SIZE = 50;
        wchar_t tagbuf[MAX_TAG_SIZE];
        wchar_t *dst;
        int is_end_tag;
        
        /* skip the opening '<' */
        c = next_wchar(sp, slenp);
        
        /* note if this is a closing tag */
        if (c == '/' || c == '\\')
        {
            /* it's an end tag - note it and skip the slash */
            is_end_tag = TRUE;
            c = next_wchar(sp, slenp);
        }
        else
            is_end_tag = FALSE;
        
        /* 
         *   find the end of the tag name - the tag continues to the next
         *   space, '>', or end of line 
         */
        for (dst = tagbuf ; c != '\0' && c != ' ' && c != '>' ;
             c = next_wchar(sp, slenp))
        {
            /* add this to the tag buffer if it fits */
            if (dst + 1 < tagbuf + MAX_TAG_SIZE)
                *dst++ = c;
        }
        
        /* null-terminate the tag name */
        *dst = '\0';
        
        /*
         *   Check to see if we recognize the tag.  We only recognize a few
         *   simple tags that map easily to character mode.  
         */
        if (CVmCaseFoldStr::wstreq(tagbuf, L"br"))
        {
            /* 
             *   line break - if there's anything buffered up, just flush the
             *   current line, otherwise write out a blank line 
             */
            if (html_in_ignore_)
                /* suppress in ignore mode */;
            else if (linepos_ != 0)
                html_defer_br_ = HTML_DEFER_BR_FLUSH;
            else
                html_defer_br_ = HTML_DEFER_BR_BLANK;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"b")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"i")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"em")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"strong"))
        {
            /* suppress in ignore mode */
            if (!html_in_ignore_)
            {
                /* check to see if this is a start or end tag */
                if (!is_end_tag)
                {
                    int attr;

                    /* it's a start tag - push the current attributes */
                    push_color();

                    /* figure the attribute we're adding */
                    switch(tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }

                    /* add the attribute */
                    cur_color_.attr |= attr;
                }
                else
                {
                    /* it's an end tag - just pop the saved attributes */
                    pop_color();
                }
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"p"))
        {
            /* paragraph - send out a blank line */
            if (!html_in_ignore_)
                write_blank_line(vmg0_);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"tab") && !html_in_ignore_)
        {
            if (!html_in_ignore_)
            {
                /* if we have a pending tab, handle it */
                expand_pending_tab(vmg_ TRUE);

                /* start a tab definition */
                html_in_tab_ = TRUE;

                /* the new tab has no known characteristics yet */
                new_tab_entry_ = 0;
                new_tab_align_ = VMFMT_TAB_NONE;
                new_tab_dp_ = L'\0';
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"img")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"sound"))
        {
            /* IMG and SOUND - allow ALT attributes */
            html_allow_alt_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"font"))
        {
            /* FONT - look for COLOR attribute */
            if (html_in_ignore_)
            {
                /* do nothing while ignoring tags */
            }
            else if (!is_end_tag)
            {
                /* enable the COLOR attribute */
                html_allow_color_ = TRUE;

                /* push the current color, in case we change it */
                push_color();
            }
            else
            {
                /* restore the color in the enclosing text */
                pop_color();
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"body"))
        {
            /* BODY - look for BGCOLOR and TEXT attributes */
            if (!html_in_ignore_ && !is_end_tag)
            {
                /* note that we're parsing a BODY tag */
                html_in_body_ = TRUE;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"hr"))
        {
            int rem;

            if (!html_in_ignore_)
            {
                /* start a new line */
                flush(vmg_ VM_NL_NEWLINE);

                /* write out underscores to the display width */
                for (rem = console_->get_line_width() - 1 ; rem > 0 ; )
                {
                    const size_t DASHBUFLEN = 100;
                    wchar_t dashbuf[DASHBUFLEN];
                    wchar_t *p;
                    size_t cur;

                    /* do as much as we can on this pass */
                    cur = rem;
                    if (cur > DASHBUFLEN - 1)
                        cur = DASHBUFLEN - 1;

                    /* deduct this from the total */
                    rem -= cur;

                    /* fill the buffer with dashes */
                    for (p = dashbuf ; cur != 0 ; --cur)
                        *p++ = '-';
                    *p = '\0';

                    /* write it out */
                    buffer_wstring(vmg_ dashbuf);
                }

                /* put a blank line after the underscores */
                write_blank_line(vmg0_);
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"q"))
        {
            wchar_t htmlchar;

            if (!html_in_ignore_)
            {
                /* if it's an open quote, increment the level */
                if (!is_end_tag)
                    ++html_quote_level_;

                /* add the open quote */
                htmlchar =
                    (!is_end_tag
                     ? ((html_quote_level_ & 1) == 1
                        ? 8220 : 8216)
                     : ((html_quote_level_ & 1) == 1
                        ? 8221 : 8217));

                /* write out the HTML quote character */
                buffer_char(vmg_ htmlchar);

                /* if it's a close quote, decrement the level */
                if (is_end_tag)
                    --html_quote_level_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"title"))
        {
            /* 
             *   Turn ignore mode on or off as appropriate, and turn on or
             *   off title mode as well.  
             */
            if (is_end_tag)
            {
                /* 
                 *   note that we're leaving an ignore section and a title
                 *   section 
                 */
                --html_in_ignore_;
                --html_in_title_;

                /*  
                 *   If we're no longer in a title, and we have a buffer
                 *   where we've gathered up the title string, call the OS
                 *   layer to tell it the title string, in case it wants to
                 *   change the window title or otherwise make use of the
                 *   title.  (Note that some streams don't bother keeping
                 *   track of the title at all, so we might not have a title
                 *   buffer.)  
                 */
                if (html_in_title_ == 0 && html_title_ptr_ != 0)
                {
                    /* null-terminate the title string */
                    *html_title_ptr_ = '\0';
                    
                    /* tell the OS about the title */
                    if (!html_in_ignore_)
                        set_title_in_os(html_title_buf_);
                }
            }
            else
            {
                /* 
                 *   if we aren't already in a title, set up to capture the
                 *   title into the title buffer 
                 */
                if (!html_in_title_)
                    html_title_ptr_ = html_title_buf_;
                
                /* 
                 *   note that we're in a title and in an ignore section,
                 *   since nothing within gets displayed 
                 */
                ++html_in_ignore_;
                ++html_in_title_;
            }
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"aboutbox")
                 || CVmCaseFoldStr::wstreq(tagbuf, L"banner"))
        {
            /* turn ignore mode on or off as appropriate */
            if (is_end_tag)
                --html_in_ignore_;
            else
                ++html_in_ignore_;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"log"))
        {
            /* handle the <log> tag according to our stream subclass */
            process_log_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"nolog"))
        {
            /* handle the <nolog> tag according to our stream subclass */
            process_nolog_tag(is_end_tag);
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"wrap"))
        {
            /* note that we have a 'wrap' tag to process */
            if (!html_in_ignore_)
                html_in_wrap_ = TRUE;
        }
        else if (CVmCaseFoldStr::wstreq(tagbuf, L"pre"))
        {
            /* count the nesting level if starting PRE mode */
            if (!is_end_tag)
                ++html_pre_level_;

            /* surround the PRE block with blank lines */
            write_blank_line(vmg0_);

            /* count the nesting level if ending PRE mode */
            if (is_end_tag && html_pre_level_ != 0)
                --html_pre_level_;
        }

        /* suppress everything up to the next '>' */
        html_parse_state_ = VMCON_HPS_TAG;

        /* 
         *   return the next character - since we're now in TAG mode, we'll
         *   resume the HTML mini-parser to parse the contents of the tag 
         */
        return c;
    }
    else if (c == '&')
    {
        /* parse the HTML markup */
        wchar_t ent;
        c = parse_entity(vmg_ &ent, sp, slenp);

        /* translate it and write it out */
        buffer_char(vmg_ ent);

        /* proceed with the next character */
        return c;
    }
    else
    {
        /* 
         *   we have nothing special to do with this character - simply
         *   buffer it and move on to the next character 
         */
        buffer_char(vmg_ c);
        return next_wchar(sp, slenp);
    }
}